

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

l_mem getdebt(global_State *g)

{
  undefined1 auVar1 [16];
  long lVar2;
  global_State *local_38;
  int stepmul;
  l_mem debt;
  global_State *g_local;
  
  if (g->GCdebt < 1) {
    g_local = (global_State *)0x0;
  }
  else {
    lVar2 = g->GCdebt / 200 + 1;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
    if (lVar2 < SUB168((auVar1 << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)g->gcstepmul),
                       0)) {
      local_38 = (global_State *)(lVar2 * g->gcstepmul);
    }
    else {
      local_38 = (global_State *)0x7fffffffffffffff;
    }
    g_local = local_38;
  }
  return (l_mem)g_local;
}

Assistant:

static l_mem getdebt (global_State *g) {
  l_mem debt = g->GCdebt;
  int stepmul = g->gcstepmul;
  if (debt <= 0) return 0;  /* minimal debt */
  else {
    debt = (debt / STEPMULADJ) + 1;
    debt = (debt < MAX_LMEM / stepmul) ? debt * stepmul : MAX_LMEM;
    return debt;
  }
}